

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O2

void embree::sphereOccludedFunc(RTCOccludedFunctionNArguments *args)

{
  uint uVar1;
  int *piVar2;
  void *pvVar3;
  RTCRayN *pRVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Db;
  float fVar8;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int imask;
  RTCFilterFunctionNArguments fargs;
  int local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  float local_90;
  undefined8 local_8c;
  uint local_84;
  undefined4 local_80;
  uint local_7c;
  int *local_60;
  void *local_58;
  RTCRayQueryContext *local_50;
  RTCRayN *pRStack_48;
  undefined8 *local_40;
  undefined4 local_38;
  
  piVar2 = args->valid;
  if (*piVar2 != 0) {
    pvVar3 = args->geometryUserPtr;
    pRVar4 = args->ray;
    uVar1 = args->primID;
    *piVar2 = 0;
    fVar6 = *(float *)(pRVar4 + 0x10);
    fVar9 = *(float *)(pRVar4 + 0x14);
    fVar15 = *(float *)(pRVar4 + 0x18);
    fVar16 = *(float *)(pRVar4 + 0x1c);
    fVar5 = *(float *)pRVar4 - *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x10);
    fVar7 = *(float *)(pRVar4 + 4) - *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x14);
    fVar8 = *(float *)(pRVar4 + 8) - *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x18);
    fVar10 = fVar9 * fVar9;
    fVar11 = fVar15 * fVar15;
    fVar12 = fVar16 * fVar16;
    fVar17 = fVar10 + fVar6 * fVar6 + fVar11;
    fVar18 = fVar10 + fVar10 + fVar12;
    fVar11 = fVar10 + fVar11 + fVar11;
    fVar12 = fVar10 + fVar12 + fVar12;
    fVar15 = fVar15 * fVar8;
    fVar16 = fVar16 * (*(float *)(pRVar4 + 0xc) -
                      *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x1c));
    local_b8 = fVar15 + fVar9 * fVar7 + fVar6 * fVar5;
    local_b8 = local_b8 + local_b8;
    fVar6 = *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x20);
    fVar6 = local_b8 * local_b8 +
            fVar17 * -4.0 * ((fVar8 * fVar8 + fVar7 * fVar7 + fVar5 * fVar5) - fVar6 * fVar6);
    if (0.0 <= fVar6) {
      if (fVar6 < 0.0) {
        fStack_b4 = fVar16;
        fStack_b0 = fVar15;
        fStack_ac = fVar16;
        local_a8 = fVar17;
        fStack_a4 = fVar18;
        fStack_a0 = fVar11;
        fStack_9c = fVar12;
        fVar6 = sqrtf(fVar6);
        fVar16 = extraout_XMM0_Db;
        fVar15 = extraout_XMM0_Dc;
        fVar9 = extraout_XMM0_Dd;
        fVar17 = local_a8;
        fVar18 = fStack_a4;
        fVar11 = fStack_a0;
        fVar12 = fStack_9c;
      }
      else {
        fVar6 = SQRT(fVar6);
        fVar9 = fVar16;
      }
      auVar13._4_4_ = fVar18;
      auVar13._0_4_ = fVar17;
      auVar13._8_4_ = fVar11;
      auVar13._12_4_ = fVar12;
      auVar14._4_4_ = fVar18;
      auVar14._0_4_ = fVar17;
      auVar14._8_4_ = fVar11;
      auVar14._12_4_ = fVar12;
      auVar14 = rcpss(auVar13,auVar14);
      fVar17 = (2.0 - fVar17 * auVar14._0_4_) * auVar14._0_4_ * 0.5;
      fVar18 = (-local_b8 - fVar6) * fVar17;
      local_8c = 0;
      fVar17 = (fVar6 - local_b8) * fVar17;
      local_50 = args->context;
      local_7c = local_50->instID[0];
      local_80 = *(undefined4 *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x30);
      fVar6 = *(float *)(pRVar4 + 0xc);
      local_b8 = *(float *)(pRVar4 + 0x20);
      local_84 = uVar1;
      if ((fVar6 < fVar18) && (fVar18 < local_b8)) {
        local_60 = &local_bc;
        local_bc = -1;
        local_90 = (fVar18 * *(float *)(pRVar4 + 0x18) + *(float *)(pRVar4 + 8)) -
                   *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x18);
        local_40 = &local_98;
        local_98 = CONCAT44((fVar18 * *(float *)(pRVar4 + 0x14) + *(float *)(pRVar4 + 4)) -
                            *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x14),
                            (fVar18 * *(float *)(pRVar4 + 0x10) + *(float *)pRVar4) -
                            *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x10));
        pRStack_48 = args->ray;
        local_38 = 1;
        *(float *)(pRVar4 + 0x20) = fVar18;
        local_a8 = fVar17;
        fStack_a4 = fVar16;
        fStack_a0 = fVar15;
        fStack_9c = fVar9;
        local_58 = pvVar3;
        rtcInvokeOccludedFilterFromGeometry(args);
        if (local_bc == -1) {
          *(float *)(pRVar4 + 0x20) = -INFINITY;
          *piVar2 = -1;
          local_b8 = *(float *)(pRVar4 + 0x20);
        }
        else {
          *(float *)(pRVar4 + 0x20) = local_b8;
        }
        fVar6 = *(float *)(pRVar4 + 0xc);
        fVar17 = local_a8;
      }
      if ((fVar6 < fVar17) && (fVar17 < local_b8)) {
        local_60 = &local_bc;
        local_bc = -1;
        local_90 = (fVar17 * *(float *)(pRVar4 + 0x18) + *(float *)(pRVar4 + 8)) -
                   *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x18);
        local_40 = &local_98;
        local_98 = CONCAT44((fVar17 * *(float *)(pRVar4 + 0x14) + *(float *)(pRVar4 + 4)) -
                            *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x14),
                            (fVar17 * *(float *)(pRVar4 + 0x10) + *(float *)pRVar4) -
                            *(float *)((long)pvVar3 + (ulong)uVar1 * 0x40 + 0x10));
        local_50 = args->context;
        pRStack_48 = args->ray;
        local_38 = 1;
        *(float *)(pRVar4 + 0x20) = fVar17;
        local_58 = pvVar3;
        rtcInvokeOccludedFilterFromGeometry(args);
        if (local_bc == -1) {
          *(float *)(pRVar4 + 0x20) = -INFINITY;
          *piVar2 = -1;
        }
        else {
          *(float *)(pRVar4 + 0x20) = local_b8;
        }
      }
    }
  }
  return;
}

Assistant:

RTC_SYCL_INDIRECTLY_CALLABLE void sphereOccludedFunc(const RTCOccludedFunctionNArguments* args)
{
  int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  Ray *ray = (Ray*)args->ray;
  unsigned int primID = args->primID;
  
  assert(args->N == 1);
  const Sphere* spheres = (const Sphere*) ptr;
  const Sphere& sphere = spheres[primID];
  
  if (!valid[0]) return;
  valid[0] = 0;

  const Vec3fa v = ray->org-sphere.p;
  const float A = dot(ray->dir,ray->dir);
  const float B = 2.0f*dot(v,ray->dir);
  const float C = dot(v,v) - sqr(sphere.r);
  const float D = B*B - 4.0f*A*C;
  if (D < 0.0f) return;
  const float Q = sqrt(D);
  const float rcpA = rcp(A);
  const float t0 = 0.5f*rcpA*(-B-Q);
  const float t1 = 0.5f*rcpA*(-B+Q);

  RTCHit potentialHit;
  potentialHit.u = 0.0f;
  potentialHit.v = 0.0f;
  copyInstanceIdStack(args->context, potentialHit.instID);
  potentialHit.geomID = sphere.geomID;
  potentialHit.primID = primID;
  if ((ray->tnear() < t0) & (t0 < ray->tfar))
  {
    int imask;
    bool mask = 1;
    {
      imask = mask ? -1 : 0;
    }
    
    const Vec3fa Ng = ray->org+t0*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;

    RTCFilterFunctionNArguments fargs;
    fargs.valid = (int*)&imask;
    fargs.geometryUserPtr = ptr;
    fargs.context = args->context;
    fargs.ray = args->ray;
    fargs.hit = (RTCHitN*)&potentialHit;
    fargs.N = 1;

    const float old_t = ray->tfar;
    ray->tfar = t0;
#if USE_ARGUMENT_CALLBACKS
    contextFilterFunction(&fargs);
#else
    rtcInvokeOccludedFilterFromGeometry(args,&fargs);
#endif
    
    if (imask == -1) {
      ray->tfar = neg_inf;
      valid[0] = -1;
    }
    else
      ray->tfar = old_t;
  }

  if ((ray->tnear() < t1) & (t1 < ray->tfar))
  {
    int imask;
    bool mask = 1;
    {
      imask = mask ? -1 : 0;
    }
    
    const Vec3fa Ng = ray->org+t1*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;

    RTCFilterFunctionNArguments fargs;
    fargs.valid = (int*)&imask;
    fargs.geometryUserPtr = ptr;
    fargs.context = args->context;
    fargs.ray = args->ray;
    fargs.hit = (RTCHitN*)&potentialHit;
    fargs.N = 1;

    const float old_t = ray->tfar;
    ray->tfar = t1;
#if USE_ARGUMENT_CALLBACKS
    contextFilterFunction(&fargs);
#else
    rtcInvokeOccludedFilterFromGeometry(args,&fargs);
#endif

    if (imask == -1) {
      ray->tfar = neg_inf;
      valid[0] = -1;
    }
    else
      ray->tfar = old_t;
  }
}